

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

Sub * __thiscall
google::protobuf::io::Printer::Sub::WithSuffix
          (Sub *__return_storage_ptr__,Sub *this,string *sub_suffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  std::__cxx11::string::operator=((string *)&(this->value_).consume_after,(string *)sub_suffix);
  paVar1 = &(__return_storage_ptr__->key_).field_2;
  (__return_storage_ptr__->key_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (this->key_)._M_dataplus._M_p;
  paVar2 = &(this->key_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(this->key_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->key_).field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->key_)._M_dataplus._M_p = pcVar3;
    (__return_storage_ptr__->key_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__return_storage_ptr__->key_)._M_string_length = (this->key_)._M_string_length;
  (this->key_)._M_dataplus._M_p = (pointer)paVar2;
  (this->key_)._M_string_length = 0;
  (this->key_).field_2._M_local_buf[0] = '\0';
  std::__detail::__variant::
  _Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                     *)&__return_storage_ptr__->value_,
                    (_Move_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                     *)&this->value_);
  paVar1 = &(__return_storage_ptr__->value_).consume_after.field_2;
  (__return_storage_ptr__->value_).consume_after._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (this->value_).consume_after._M_dataplus._M_p;
  paVar2 = &(this->value_).consume_after.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(this->value_).consume_after.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->value_).consume_after.field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->value_).consume_after._M_dataplus._M_p = pcVar3;
    (__return_storage_ptr__->value_).consume_after.field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (__return_storage_ptr__->value_).consume_after._M_string_length =
       (this->value_).consume_after._M_string_length;
  (this->value_).consume_after._M_dataplus._M_p = (pointer)paVar2;
  (this->value_).consume_after._M_string_length = 0;
  (this->value_).consume_after.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_).consume_parens_if_empty = (this->value_).consume_parens_if_empty;
  (__return_storage_ptr__->annotation_).
  super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload.
  super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
  super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged = false;
  if ((this->annotation_).
      super__Optional_base<google::protobuf::io::Printer::AnnotationRecord,_false,_false>._M_payload
      .super__Optional_payload<google::protobuf::io::Printer::AnnotationRecord,_true,_false,_false>.
      super__Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>._M_engaged ==
      true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::
    _M_construct<google::protobuf::io::Printer::AnnotationRecord>
              ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
               &__return_storage_ptr__->annotation_,(AnnotationRecord *)&this->annotation_);
  }
  return __return_storage_ptr__;
}

Assistant:

Sub WithSuffix(std::string sub_suffix) && {
    value_.consume_after = std::move(sub_suffix);
    return std::move(*this);
  }